

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O0

void __thiscall
irr::core::array<irr::scene::ISkinnedMesh::SPositionKey>::erase
          (array<irr::scene::ISkinnedMesh::SPositionKey> *this,u32 index,s32 count)

{
  size_type sVar1;
  int *piVar2;
  __normal_iterator<irr::scene::ISkinnedMesh::SPositionKey_*,_std::vector<irr::scene::ISkinnedMesh::SPositionKey,_std::allocator<irr::scene::ISkinnedMesh::SPositionKey>_>_>
  __first;
  int in_EDX;
  uint in_ESI;
  vector<irr::scene::ISkinnedMesh::SPositionKey,_std::allocator<irr::scene::ISkinnedMesh::SPositionKey>_>
  *in_RDI;
  __normal_iterator<irr::scene::ISkinnedMesh::SPositionKey_*,_std::vector<irr::scene::ISkinnedMesh::SPositionKey,_std::allocator<irr::scene::ISkinnedMesh::SPositionKey>_>_>
  last;
  __normal_iterator<irr::scene::ISkinnedMesh::SPositionKey_*,_std::vector<irr::scene::ISkinnedMesh::SPositionKey,_std::allocator<irr::scene::ISkinnedMesh::SPositionKey>_>_>
  first;
  __normal_iterator<irr::scene::ISkinnedMesh::SPositionKey_*,_std::vector<irr::scene::ISkinnedMesh::SPositionKey,_std::allocator<irr::scene::ISkinnedMesh::SPositionKey>_>_>
  in_stack_ffffffffffffff98;
  vector<irr::scene::ISkinnedMesh::SPositionKey,_std::allocator<irr::scene::ISkinnedMesh::SPositionKey>_>
  *in_stack_ffffffffffffffb8;
  const_iterator in_stack_ffffffffffffffc0;
  int local_14;
  int local_10;
  uint local_c;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  sVar1 = ::std::
          vector<irr::scene::ISkinnedMesh::SPositionKey,_std::allocator<irr::scene::ISkinnedMesh::SPositionKey>_>
          ::size(in_RDI);
  if ((in_ESI < sVar1) && (0 < local_10)) {
    sVar1 = ::std::
            vector<irr::scene::ISkinnedMesh::SPositionKey,_std::allocator<irr::scene::ISkinnedMesh::SPositionKey>_>
            ::size(in_RDI);
    local_14 = (int)sVar1 - local_c;
    piVar2 = min_<int>(&local_10,&local_14);
    local_10 = *piVar2;
    ::std::
    vector<irr::scene::ISkinnedMesh::SPositionKey,_std::allocator<irr::scene::ISkinnedMesh::SPositionKey>_>
    ::begin((vector<irr::scene::ISkinnedMesh::SPositionKey,_std::allocator<irr::scene::ISkinnedMesh::SPositionKey>_>
             *)in_stack_ffffffffffffff98._M_current);
    __first = ::std::
              next<__gnu_cxx::__normal_iterator<irr::scene::ISkinnedMesh::SPositionKey*,std::vector<irr::scene::ISkinnedMesh::SPositionKey,std::allocator<irr::scene::ISkinnedMesh::SPositionKey>>>>
                        (in_stack_ffffffffffffff98,0x2b7768);
    ::std::
    next<__gnu_cxx::__normal_iterator<irr::scene::ISkinnedMesh::SPositionKey*,std::vector<irr::scene::ISkinnedMesh::SPositionKey,std::allocator<irr::scene::ISkinnedMesh::SPositionKey>>>>
              (in_stack_ffffffffffffff98,0x2b7786);
    __gnu_cxx::
    __normal_iterator<irr::scene::ISkinnedMesh::SPositionKey_const*,std::vector<irr::scene::ISkinnedMesh::SPositionKey,std::allocator<irr::scene::ISkinnedMesh::SPositionKey>>>
    ::__normal_iterator<irr::scene::ISkinnedMesh::SPositionKey*>
              ((__normal_iterator<const_irr::scene::ISkinnedMesh::SPositionKey_*,_std::vector<irr::scene::ISkinnedMesh::SPositionKey,_std::allocator<irr::scene::ISkinnedMesh::SPositionKey>_>_>
                *)in_RDI,
               (__normal_iterator<irr::scene::ISkinnedMesh::SPositionKey_*,_std::vector<irr::scene::ISkinnedMesh::SPositionKey,_std::allocator<irr::scene::ISkinnedMesh::SPositionKey>_>_>
                *)in_stack_ffffffffffffff98._M_current);
    __gnu_cxx::
    __normal_iterator<irr::scene::ISkinnedMesh::SPositionKey_const*,std::vector<irr::scene::ISkinnedMesh::SPositionKey,std::allocator<irr::scene::ISkinnedMesh::SPositionKey>>>
    ::__normal_iterator<irr::scene::ISkinnedMesh::SPositionKey*>
              ((__normal_iterator<const_irr::scene::ISkinnedMesh::SPositionKey_*,_std::vector<irr::scene::ISkinnedMesh::SPositionKey,_std::allocator<irr::scene::ISkinnedMesh::SPositionKey>_>_>
                *)in_RDI,
               (__normal_iterator<irr::scene::ISkinnedMesh::SPositionKey_*,_std::vector<irr::scene::ISkinnedMesh::SPositionKey,_std::allocator<irr::scene::ISkinnedMesh::SPositionKey>_>_>
                *)in_stack_ffffffffffffff98._M_current);
    ::std::
    vector<irr::scene::ISkinnedMesh::SPositionKey,_std::allocator<irr::scene::ISkinnedMesh::SPositionKey>_>
    ::erase(in_stack_ffffffffffffffb8,(const_iterator)__first._M_current,in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

void erase(u32 index, s32 count)
	{
		if (index >= m_data.size() || count < 1)
			return;
		count = core::min_(count, (s32)m_data.size() - (s32)index);
		auto first = std::next(m_data.begin(), index);
		auto last = std::next(first, count);
		m_data.erase(first, last);
	}